

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogConverterCustomText.h
# Opt level: O1

void __thiscall
nowtech::log::
ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)'d',_true,_false>
::convert(ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)_d_,_true,_false>
          *this,bool aValue,uint8_t param_2,uint8_t param_3)

{
  char cVar1;
  char *pcVar2;
  undefined3 in_register_00000031;
  
  pcVar2 = "false";
  if (CONCAT31(in_register_00000031,aValue) != 0) {
    pcVar2 = "true";
  }
  cVar1 = *pcVar2;
  while (cVar1 != '\0') {
    pcVar2 = pcVar2 + 1;
    if (this->mEnd <= this->mBegin) break;
    *this->mBegin = cVar1;
    this->mBegin = this->mBegin + 1;
    cVar1 = *pcVar2;
  }
  if (this->mBegin < this->mEnd) {
    *this->mBegin = ' ';
    this->mBegin = this->mBegin + 1;
  }
  return;
}

Assistant:

void convert(bool const aValue, uint8_t const, uint8_t const) noexcept {
    append(aValue ? csTrue : csFalse);
    appendSpace();
  }